

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempArenaAllocatorObject.cpp
# Opt level: O3

TempArenaAllocatorWrapper<false> *
Js::TempArenaAllocatorWrapper<false>::Create(ThreadContext *threadContext)

{
  Recycler *alloc;
  TempArenaAllocatorWrapper<false> *this;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ff7376;
  data.filename._0_4_ = 0xe;
  alloc = Memory::Recycler::TrackAllocInfo(threadContext->recycler,(TrackAllocData *)local_40);
  this = (TempArenaAllocatorWrapper<false> *)new<Memory::Recycler>(0x98,alloc,0x7a9828);
  TempArenaAllocatorWrapper
            (this,L"temp",&(threadContext->pageAllocator).super_PageAllocator,Throw::OutOfMemory);
  return this;
}

Assistant:

TempArenaAllocatorWrapper<isGuestArena>* TempArenaAllocatorWrapper<isGuestArena>::Create(ThreadContext * threadContext)
    {
        Recycler * recycler = threadContext->GetRecycler();
        TempArenaAllocatorWrapper<isGuestArena> * wrapper = RecyclerNewFinalizedLeaf(recycler, Js::TempArenaAllocatorWrapper<isGuestArena>,
            _u("temp"), threadContext->GetPageAllocator(), Js::Throw::OutOfMemory);
        if (isGuestArena)
        {
            wrapper->recycler = recycler;
            wrapper->AdviseInUse();
        }
        return wrapper;
    }